

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handles.hpp
# Opt level: O0

shared_lock_handle<int,_std::shared_timed_mutex> * __thiscall
gmlc::libguarded::try_lock_shared_handle<int,std::shared_timed_mutex>
          (shared_lock_handle<int,_std::shared_timed_mutex> *__return_storage_ptr__,libguarded *this
          ,int *obj,shared_timed_mutex *smutex)

{
  bool bVar1;
  shared_lock<std::shared_timed_mutex> local_68;
  undefined4 local_58;
  shared_lock<std::shared_timed_mutex> local_48;
  undefined1 local_30 [8];
  lock_type slock;
  shared_timed_mutex *smutex_local;
  int *obj_local;
  
  slock._8_8_ = obj;
  std::shared_lock<std::shared_timed_mutex>::shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_30,obj);
  bVar1 = std::shared_lock<std::shared_timed_mutex>::owns_lock
                    ((shared_lock<std::shared_timed_mutex> *)local_30);
  if (bVar1) {
    std::shared_lock<std::shared_timed_mutex>::shared_lock
              (&local_48,(shared_lock<std::shared_timed_mutex> *)local_30);
    shared_lock_handle<int,_std::shared_timed_mutex>::shared_lock_handle
              (__return_storage_ptr__,(pointer)this,&local_48);
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_48);
  }
  else {
    std::shared_lock<std::shared_timed_mutex>::shared_lock
              (&local_68,(shared_lock<std::shared_timed_mutex> *)local_30);
    shared_lock_handle<int,_std::shared_timed_mutex>::shared_lock_handle
              (__return_storage_ptr__,(pointer)0x0,&local_68);
    std::shared_lock<std::shared_timed_mutex>::~shared_lock(&local_68);
  }
  local_58 = 1;
  std::shared_lock<std::shared_timed_mutex>::~shared_lock
            ((shared_lock<std::shared_timed_mutex> *)local_30);
  return __return_storage_ptr__;
}

Assistant:

shared_lock_handle<T, M> try_lock_shared_handle(const T* obj, M& smutex)
{
    typename shared_lock_handle<T, M>::lock_type slock(smutex,
                                                       std::try_to_lock);
    if (slock.owns_lock()) {
        return shared_lock_handle<T, M>(obj, std::move(slock));
    } else {
        return shared_lock_handle<T, M>(nullptr, std::move(slock));
    }
}